

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitplane.cpp
# Opt level: O3

bool ConvexDecomposition::computeSplitPlane
               (uint vcount,float *vertices,uint tcount,uint *indices,
               ConvexDecompInterface *callback,float *plane)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  float fVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (vcount == 0) {
    auVar14 = ZEXT1664(CONCAT412(0xce6e6b28,CONCAT48(0xce6e6b28,0xce6e6b28ce6e6b28)));
    auVar10 = ZEXT1664(CONCAT412(0x4e6e6b28,CONCAT48(0x4e6e6b28,0x4e6e6b284e6e6b28)));
    auVar12 = ZEXT464(0x4e6e6b28);
    auVar16 = ZEXT464(0xce6e6b28);
  }
  else {
    auVar14 = ZEXT1664(CONCAT412(0xce6e6b28,CONCAT48(0xce6e6b28,0xce6e6b28ce6e6b28)));
    auVar10 = ZEXT1664(CONCAT412(0x4e6e6b28,CONCAT48(0x4e6e6b28,0x4e6e6b284e6e6b28)));
    auVar16 = ZEXT464(0xce6e6b28);
    auVar12 = ZEXT464(0x4e6e6b28);
    uVar7 = 0;
    do {
      uVar8 = uVar7 & 0xffffffff;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(vertices + uVar8 + 1);
      uVar7 = uVar7 + 3;
      auVar1 = vminss_avx(ZEXT416((uint)vertices[uVar8]),auVar12._0_16_);
      auVar12 = ZEXT1664(auVar1);
      auVar1 = vminps_avx(auVar19,auVar10._0_16_);
      auVar10 = ZEXT1664(auVar1);
      auVar1 = vmaxss_avx(ZEXT416((uint)vertices[uVar8]),auVar16._0_16_);
      auVar16 = ZEXT1664(auVar1);
      auVar1 = vmaxps_avx(auVar19,auVar14._0_16_);
      auVar14 = ZEXT1664(auVar1);
    } while ((ulong)vcount * 3 != uVar7);
  }
  auVar9 = auVar10._0_16_;
  auVar13 = auVar14._0_16_;
  auVar2 = vsubps_avx(auVar13,auVar9);
  fVar11 = auVar12._0_4_;
  fVar15 = auVar16._0_4_;
  fVar22 = fVar15 - fVar11;
  auVar19 = vmovshdup_avx(auVar9);
  fVar21 = auVar19._0_4_;
  auVar1 = vmovshdup_avx(auVar2);
  fVar23 = auVar2._0_4_;
  uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar22),auVar1,1);
  uVar8 = vcmpps_avx512vl(auVar2,auVar1,1);
  auVar18 = SUB6416(ZEXT464(0x3f000000),0);
  auVar5 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar22),auVar12._0_16_);
  auVar2 = vfmadd213ss_fma(auVar18,auVar2,auVar9);
  auVar18 = vfmadd213ss_fma(auVar18,auVar1,auVar19);
  cVar6 = '\x02';
  if ((uVar7 & uVar8 & 1) == 0) {
    cVar6 = fVar22 < fVar23;
  }
  fVar20 = auVar2._0_4_;
  fVar17 = auVar18._0_4_;
  if (cVar6 == '\0') {
    if (auVar1._0_4_ <= fVar23) {
      auVar19 = vmovshdup_avx(auVar13);
      auVar14 = ZEXT1664(auVar9);
    }
    fVar23 = auVar14._0_4_;
    fVar22 = auVar19._0_4_;
    auVar12 = ZEXT1664(auVar5);
    fVar11 = auVar5._0_4_;
  }
  else if (cVar6 == '\x01') {
    fVar23 = fVar20;
    if (fVar22 <= auVar1._0_4_) {
      auVar1 = vmovshdup_avx(auVar13);
      auVar10 = ZEXT1664(auVar2);
      fVar22 = auVar1._0_4_;
    }
    else {
      auVar10 = ZEXT1664(auVar2);
      fVar22 = fVar21;
      fVar11 = fVar15;
    }
  }
  else {
    if (fVar23 < fVar22) {
      auVar14 = ZEXT1664(auVar9);
      fVar11 = fVar15;
    }
    fVar23 = auVar14._0_4_;
    fVar22 = fVar17;
    fVar21 = fVar17;
  }
  fVar23 = auVar10._0_4_ - fVar23;
  fVar15 = fVar20 - auVar10._0_4_;
  fVar11 = auVar12._0_4_ - fVar11;
  fVar3 = auVar5._0_4_ - auVar12._0_4_;
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)((fVar21 - fVar22) * fVar15)),ZEXT416((uint)fVar23),
                            ZEXT416((uint)(fVar17 - fVar21)));
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)((fVar17 - fVar21) * fVar11)),ZEXT416((uint)fVar3),
                           ZEXT416((uint)(fVar21 - fVar22)));
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar23)),ZEXT416((uint)fVar11),
                           ZEXT416((uint)fVar15));
  fVar15 = auVar1._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar19,auVar19);
  auVar1 = vfmadd231ss_fma(auVar1,auVar2,auVar2);
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  uVar4 = vcmpss_avx512f(auVar1,ZEXT416(0x358637bd),1);
  fVar21 = (float)((uint)!(bool)((byte)uVar4 & 1) * (int)(1.0 / auVar1._0_4_));
  fVar22 = auVar19._0_4_ * fVar21;
  fVar11 = auVar2._0_4_ * fVar21;
  *plane = fVar22;
  plane[1] = fVar15 * fVar21;
  plane[2] = fVar11;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar15 * fVar21)),ZEXT416((uint)fVar22),auVar5);
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar11),auVar18);
  plane[3] = 0.0 - auVar1._0_4_;
  return true;
}

Assistant:

bool computeSplitPlane(unsigned int vcount,
                       const float *vertices,
                       unsigned int tcount,
                       const unsigned int *indices,
                       ConvexDecompInterface *callback,
                       float *plane)
{
  float bmin[3] = { 1e9, 1e9, 1e9 };
  float bmax[3] = { -1e9, -1e9, -1e9 };

 	for (unsigned int i=0; i<vcount; i++)
 	{
    const float *p = &vertices[i*3];

 		if ( p[0] < bmin[0] ) bmin[0] = p[0];
 		if ( p[1] < bmin[1] ) bmin[1] = p[1];
 		if ( p[2] < bmin[2] ) bmin[2] = p[2];

 		if ( p[0] > bmax[0] ) bmax[0] = p[0];
 		if ( p[1] > bmax[1] ) bmax[1] = p[1];
 		if ( p[2] > bmax[2] ) bmax[2] = p[2];

  }

  float dx = bmax[0] - bmin[0];
  float dy = bmax[1] - bmin[1];
  float dz = bmax[2] - bmin[2];


	float laxis = dx;

	unsigned int axis = 0;

	if ( dy > dx )
	{
		axis = 1;
		laxis = dy;
	}

	if ( dz > dx && dz > dy )
	{
		axis = 2;
		laxis = dz;
	}

  float p1[3];
  float p2[3];
  float p3[3];

  p3[0] = p2[0] = p1[0] = bmin[0] + dx*0.5f;
  p3[1] = p2[1] = p1[1] = bmin[1] + dy*0.5f;
  p3[2] = p2[2] = p1[2] = bmin[2] + dz*0.5f;

  Rect3d b(bmin,bmax);

  Rect3d b1,b2;

  splitRect(axis,b,b1,b2,p1);


//  callback->ConvexDebugBound(b1.mMin,b1.mMax,0x00FF00);
//  callback->ConvexDebugBound(b2.mMin,b2.mMax,0xFFFF00);

  switch ( axis )
  {
    case 0:
      p2[1] = bmin[1];
      p2[2] = bmin[2];

      if ( dz > dy )
      {
        p3[1] = bmax[1];
        p3[2] = bmin[2];
      }
      else
      {
        p3[1] = bmin[1];
        p3[2] = bmax[2];
      }

      break;
    case 1:
      p2[0] = bmin[0];
      p2[2] = bmin[2];

      if ( dx > dz )
      {
        p3[0] = bmax[0];
        p3[2] = bmin[2];
      }
      else
      {
        p3[0] = bmin[0];
        p3[2] = bmax[2];
      }

      break;
    case 2:
      p2[0] = bmin[0];
      p2[1] = bmin[1];

      if ( dx > dy )
      {
        p3[0] = bmax[0];
        p3[1] = bmin[1];
      }
      else
      {
        p3[0] = bmin[0];
        p3[1] = bmax[1];
      }

      break;
  }

//  callback->ConvexDebugTri(p1,p2,p3,0xFF0000);

	computePlane(p1,p2,p3,plane);

  return true;

}